

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgridlayout.cpp
# Opt level: O2

QSize __thiscall QGridLayout::maximumSize(QGridLayout *this)

{
  QGridLayoutPrivate *this_00;
  int hSpacing;
  int vSpacing;
  uint uVar1;
  QSize QVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  
  this_00 = *(QGridLayoutPrivate **)&(this->super_QLayout).field_0x8;
  hSpacing = horizontalSpacing(this);
  vSpacing = verticalSpacing(this);
  QVar2 = QGridLayoutPrivate::maximumSize(this_00,hSpacing,vSpacing);
  uVar4 = this_00->rightMargin + QVar2.wd.m_i.m_i + this_00->leftMargin;
  uVar1 = QVar2.ht.m_i.m_i + this_00->topMargin + this_00->bottomMargin;
  uVar5 = (ulong)uVar4;
  if (0x7fffe < (int)uVar4) {
    uVar5 = 0x7ffff;
  }
  if (0x7fffe < (int)uVar1) {
    uVar1 = 0x7ffff;
  }
  uVar3 = (ulong)uVar1;
  uVar1 = (this->super_QLayout).super_QLayoutItem.align.
          super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.super_QFlagsStorage<Qt::AlignmentFlag>.i;
  if ((uVar1 & 0x1f) != 0) {
    uVar5 = 0x7ffff;
  }
  if ((uVar1 & 0x1e0) != 0) {
    uVar3 = 0x7ffff;
  }
  return (QSize)(uVar3 << 0x20 | uVar5);
}

Assistant:

QSize QGridLayout::maximumSize() const
{
    Q_D(const QGridLayout);

    QSize s = d->maximumSize(horizontalSpacing(), verticalSpacing());
    int left, top, right, bottom;
    d->effectiveMargins(&left, &top, &right, &bottom);
    s += QSize(left + right, top + bottom);
    s = s.boundedTo(QSize(QLAYOUTSIZE_MAX, QLAYOUTSIZE_MAX));
    if (alignment() & Qt::AlignHorizontal_Mask)
        s.setWidth(QLAYOUTSIZE_MAX);
    if (alignment() & Qt::AlignVertical_Mask)
        s.setHeight(QLAYOUTSIZE_MAX);
    return s;
}